

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,StringTree *params_4,ArrayPtr<const_char> *params_5)

{
  size_t sVar1;
  ArrayPtr<const_char> *pAVar2;
  StringTree *pSVar3;
  char *pos;
  ArrayPtr<const_char> *rest;
  ArrayPtr<const_char> *rest_1;
  ArrayPtr<const_char> *rest_2;
  ArrayPtr<const_char> *rest_4;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  size_t local_140;
  size_t local_138;
  size_t local_130;
  size_t local_128;
  size_t local_120;
  size_t local_118;
  _ *local_110;
  undefined8 local_108;
  Array<kj::StringTree::Branch> local_100;
  size_t local_e8;
  size_t local_e0;
  size_t local_d8;
  size_t local_d0;
  size_t local_c8;
  size_t local_c0;
  _ *local_b8;
  undefined8 local_b0;
  String local_a8;
  size_t local_80;
  size_t local_78;
  size_t local_70;
  size_t local_68;
  size_t local_60;
  size_t local_58;
  _ *local_50;
  undefined8 local_48;
  undefined1 local_39;
  StringTree *local_38;
  StringTree *params_local_4;
  ArrayPtr<const_char> *params_local_3;
  ArrayPtr<const_char> *params_local_2;
  ArrayPtr<const_char> *params_local_1;
  ArrayPtr<const_char> *params_local;
  StringTree *result;
  
  local_39 = 0;
  local_38 = (StringTree *)params_3;
  params_local_4 = (StringTree *)params_2;
  params_local_3 = params_1;
  params_local_2 = params;
  params_local_1 = (ArrayPtr<const_char> *)this;
  params_local = (ArrayPtr<const_char> *)__return_storage_ptr__;
  StringTree(__return_storage_ptr__);
  local_80 = ArrayPtr<const_char>::size(params_local_1);
  local_78 = ArrayPtr<const_char>::size(params_local_2);
  local_70 = ArrayPtr<const_char>::size(params_local_3);
  local_68 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_local_4);
  local_60 = size(local_38);
  local_58 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_4);
  local_50 = (_ *)&local_80;
  local_48 = 6;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x6;
  sVar1 = _::sum(local_50,nums);
  __return_storage_ptr__->size_ = sVar1;
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_1);
  local_e8 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_2);
  local_e0 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_3);
  local_d8 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_4);
  local_d0 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>(local_38);
  local_c8 = flatSize(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_4);
  local_c0 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  local_b8 = (_ *)&local_e8;
  local_b0 = 6;
  nums_00._M_len = extraout_RDX_00;
  nums_00._M_array = (iterator)0x6;
  sVar1 = _::sum(local_b8,nums_00);
  heapString(&local_a8,sVar1);
  String::operator=(&__return_storage_ptr__->text,&local_a8);
  String::~String(&local_a8);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_1);
  local_140 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_2);
  local_138 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_3);
  local_130 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_4);
  local_128 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>(local_38);
  local_120 = branchCount(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_4);
  local_118 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  local_110 = (_ *)&local_140;
  local_108 = 6;
  nums_01._M_len = extraout_RDX_01;
  nums_01._M_array = (iterator)0x6;
  sVar1 = _::sum(local_110,nums_01);
  heapArray<kj::StringTree::Branch>(&local_100,sVar1);
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_100);
  Array<kj::StringTree::Branch>::~Array(&local_100);
  pos = String::begin(&__return_storage_ptr__->text);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_1);
  rest = fwd<kj::ArrayPtr<char_const>>(params_local_2);
  rest_1 = fwd<kj::ArrayPtr<char_const>>(params_local_3);
  rest_2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_4);
  pSVar3 = fwd<kj::StringTree>(local_38);
  rest_4 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_4);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,pAVar2,rest,rest_1,rest_2,pSVar3,rest_4);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}